

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

bool compilearg(vector<unsigned_int> *code,char **p,int wordtype)

{
  char *pcVar1;
  bool bVar2;
  int wordlen;
  char *word;
  int local_2c;
  char *local_28;
  
  local_28 = (char *)0x0;
  local_2c = 0;
  bVar2 = compileword(code,p,wordtype,&local_28,&local_2c);
  pcVar1 = local_28;
  if ((bVar2) && (local_28 != (char *)0x0)) {
    compileval(code,wordtype,local_28,local_2c);
    operator_delete__(pcVar1);
  }
  return bVar2;
}

Assistant:

static inline bool compilearg(vector<uint> &code, const char *&p, int wordtype)
{
    char *word = NULL;
    int wordlen = 0;
    bool more = compileword(code, p, wordtype, word, wordlen);
    if(!more) return false;
    if(word)
    {
        compileval(code, wordtype, word, wordlen);
        delete[] word;
    }
    return true;
}